

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

wasm_externkind_t FromWabtExternKind(ExternKind kind)

{
  wasm_externkind_t local_9;
  ExternKind kind_local;
  
  switch(kind) {
  case First:
    local_9 = '\0';
    break;
  case Table:
    local_9 = '\x02';
    break;
  case Memory:
    local_9 = '\x03';
    break;
  case Global:
    local_9 = '\x01';
    break;
  case Last:
    abort();
  default:
    abort();
  }
  return local_9;
}

Assistant:

static wasm_externkind_t FromWabtExternKind(ExternKind kind) {
  switch (kind) {
    case ExternalKind::Func:
      return WASM_EXTERN_FUNC;
    case ExternalKind::Global:
      return WASM_EXTERN_GLOBAL;
    case ExternalKind::Table:
      return WASM_EXTERN_TABLE;
    case ExternalKind::Memory:
      return WASM_EXTERN_MEMORY;
    case ExternalKind::Tag:
      WABT_UNREACHABLE;
  }
  WABT_UNREACHABLE;
}